

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cpp
# Opt level: O3

int __thiscall ncnn::Tile::forward(Tile *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  size_t sVar7;
  int *piVar8;
  size_t sVar9;
  void *pvVar10;
  size_t __n;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  Allocator *pAVar19;
  uint uVar20;
  void *pvVar21;
  uint uVar22;
  size_t __n_00;
  long lVar23;
  long lVar24;
  ulong local_68;
  
  iVar14 = bottom_blob->dims;
  iVar1 = (this->repeats).w;
  puVar6 = (uint *)(this->repeats).data;
  if ((puVar6 == (uint *)0x0) || ((long)(this->repeats).c * (this->repeats).cstep == 0)) {
    switch(iVar14) {
    case 1:
      uVar20 = this->tiles;
      goto LAB_0035ebdd;
    case 2:
      uVar20 = this->tiles;
      uVar17 = 1;
      if (this->axis == 0) {
        uVar17 = uVar20;
      }
      if (this->axis != 1) {
        uVar20 = 1;
      }
      goto LAB_0035ed06;
    case 3:
      iVar2 = this->axis;
      uVar20 = this->tiles;
      uVar22 = 1;
      if (iVar2 == 0) {
        uVar22 = uVar20;
      }
      uVar17 = 1;
      if (iVar2 == 1) {
        uVar17 = uVar20;
      }
      uVar18 = 1;
      if (iVar2 != 2) {
        uVar20 = 1;
      }
      break;
    case 4:
      iVar2 = this->axis;
      uVar5 = this->tiles;
      uVar22 = 1;
      if (iVar2 == 0) {
        uVar22 = uVar5;
      }
      uVar18 = 1;
      if (iVar2 == 1) {
        uVar18 = uVar5;
      }
      uVar17 = 1;
      if (iVar2 == 2) {
        uVar17 = uVar5;
      }
      uVar20 = 1;
      if (iVar2 == 3) {
        uVar20 = uVar5;
      }
      break;
    default:
      goto switchD_0035ebb1_default;
    }
  }
  else {
    switch(iVar1) {
    case 1:
      uVar20 = *puVar6;
LAB_0035ebdd:
      uVar17 = 1;
      uVar22 = 1;
      uVar18 = 1;
      break;
    case 2:
      uVar17 = *puVar6;
      uVar20 = puVar6[1];
LAB_0035ed06:
      uVar22 = 1;
      uVar18 = 1;
      break;
    case 3:
      uVar17 = puVar6[1];
      uVar20 = puVar6[2];
      uVar22 = *puVar6;
      uVar18 = 1;
      if (iVar14 == 4) {
        uVar22 = 1;
        uVar18 = *puVar6;
      }
      break;
    case 4:
      uVar17 = puVar6[2];
      uVar20 = puVar6[3];
      uVar22 = *puVar6;
      uVar18 = puVar6[1];
      break;
    default:
switchD_0035ebb1_default:
      uVar17 = 1;
      uVar20 = 1;
      uVar22 = 1;
      uVar18 = 1;
    }
  }
  iVar2 = bottom_blob->w;
  iVar3 = bottom_blob->h;
  iVar4 = bottom_blob->d;
  lVar16 = (long)iVar4;
  uVar5 = bottom_blob->c;
  sVar7 = bottom_blob->elemsize;
  iVar13 = iVar1;
  if (iVar1 < iVar14) {
    iVar13 = iVar14;
  }
  uVar12 = uVar5;
  iVar11 = iVar4;
  if ((((uVar20 == 1) || (uVar17 != 1)) || (uVar18 != 1)) || (uVar22 != 1)) {
    if (((uVar17 == 1) || (uVar18 != 1)) || (uVar22 != 1)) {
      if ((uVar18 == 1) && (uVar22 != 1)) {
        if (iVar13 != 4) {
          if (iVar13 != 3) goto switchD_0035ed6c_default;
LAB_0035edf6:
          pAVar19 = opt->blob_allocator;
          uVar12 = uVar5 * uVar22;
          iVar14 = iVar3 * uVar17;
          goto LAB_0035ef56;
        }
        pAVar19 = opt->blob_allocator;
        iVar14 = iVar3 * uVar17;
        uVar12 = uVar5 * uVar22;
      }
      else {
        if ((uVar18 == 1) || (uVar22 == 1)) {
          if (iVar14 == iVar1 || iVar1 == 0) {
            if (top_blob == bottom_blob) {
              return 0;
            }
            piVar8 = bottom_blob->refcount;
            if (piVar8 != (int *)0x0) {
              LOCK();
              *piVar8 = *piVar8 + 1;
              UNLOCK();
            }
            piVar8 = top_blob->refcount;
            if (piVar8 != (int *)0x0) {
              LOCK();
              *piVar8 = *piVar8 + -1;
              UNLOCK();
              if (*piVar8 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
            *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            piVar8 = bottom_blob->refcount;
            top_blob->data = bottom_blob->data;
            top_blob->refcount = piVar8;
            top_blob->elemsize = bottom_blob->elemsize;
            top_blob->elempack = bottom_blob->elempack;
            top_blob->allocator = bottom_blob->allocator;
            iVar14 = bottom_blob->w;
            iVar1 = bottom_blob->h;
            iVar2 = bottom_blob->d;
            top_blob->dims = bottom_blob->dims;
            top_blob->w = iVar14;
            top_blob->h = iVar1;
            top_blob->d = iVar2;
            top_blob->c = bottom_blob->c;
            top_blob->cstep = bottom_blob->cstep;
            return 0;
          }
          if (iVar13 != 4) {
            if (iVar13 != 3) goto LAB_0035edaf;
            goto LAB_0035edf6;
          }
        }
        else if (iVar13 != 4) goto switchD_0035ed6c_default;
        pAVar19 = opt->blob_allocator;
        iVar11 = iVar4 * uVar18;
        iVar14 = iVar3 * uVar17;
        uVar12 = uVar5 * uVar22;
      }
    }
    else {
      if (iVar13 != 4) {
        if (iVar13 == 3) {
          pAVar19 = opt->blob_allocator;
          iVar14 = iVar3 * uVar17;
          goto LAB_0035ef56;
        }
LAB_0035edaf:
        if (iVar13 != 2) goto switchD_0035ed6c_default;
        pAVar19 = opt->blob_allocator;
        iVar14 = iVar3 * uVar17;
        goto LAB_0035eec6;
      }
      pAVar19 = opt->blob_allocator;
      iVar14 = iVar3 * uVar17;
    }
LAB_0035efb6:
    Mat::create(top_blob,iVar2 * uVar20,iVar14,iVar11,uVar12,sVar7,pAVar19);
  }
  else {
    switch(iVar13) {
    case 1:
      Mat::create(top_blob,iVar2 * uVar20,sVar7,opt->blob_allocator);
      break;
    case 2:
      pAVar19 = opt->blob_allocator;
      iVar14 = iVar3;
LAB_0035eec6:
      Mat::create(top_blob,iVar2 * uVar20,iVar14,sVar7,pAVar19);
      break;
    case 3:
      pAVar19 = opt->blob_allocator;
      iVar14 = iVar3;
LAB_0035ef56:
      Mat::create(top_blob,iVar2 * uVar20,iVar14,uVar12,sVar7,pAVar19);
      break;
    case 4:
      pAVar19 = opt->blob_allocator;
      iVar14 = iVar3;
      goto LAB_0035efb6;
    }
  }
switchD_0035ed6c_default:
  iVar14 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (0 < (int)uVar5) {
      __n = (long)(int)(iVar2 * uVar20 * iVar3) * 4;
      __n_00 = (long)(int)(iVar4 * iVar3 * iVar2 * uVar17 * uVar20) * 4;
      local_68 = 0;
      do {
        if (0 < iVar4) {
          lVar23 = 0;
          do {
            if (0 < iVar3) {
              lVar24 = 0;
              do {
                if (0 < (int)uVar20) {
                  sVar7 = bottom_blob->cstep;
                  sVar9 = bottom_blob->elemsize;
                  pvVar10 = bottom_blob->data;
                  iVar14 = bottom_blob->h;
                  lVar15 = (long)bottom_blob->w * sVar9;
                  pvVar21 = (void *)(((top_blob->h * lVar23 + lVar24) * (long)top_blob->w +
                                     top_blob->cstep * local_68) * top_blob->elemsize +
                                    (long)top_blob->data);
                  uVar12 = uVar20;
                  do {
                    memcpy(pvVar21,(void *)((long)pvVar10 +
                                           lVar15 * lVar24 + iVar14 * lVar23 * lVar15 +
                                           sVar7 * local_68 * sVar9),(long)iVar2 * 4);
                    pvVar21 = (void *)((long)pvVar21 + (long)iVar2 * 4);
                    uVar12 = uVar12 - 1;
                  } while (uVar12 != 0);
                }
                lVar24 = lVar24 + 1;
              } while (lVar24 != iVar3);
            }
            lVar23 = lVar23 + 1;
          } while (lVar23 != lVar16);
          if (0 < iVar4) {
            lVar23 = 0;
            do {
              if (1 < (int)uVar17) {
                iVar14 = top_blob->w;
                iVar1 = top_blob->h;
                lVar24 = top_blob->cstep * local_68;
                pvVar10 = top_blob->data;
                sVar7 = top_blob->elemsize;
                pvVar21 = (void *)(((lVar23 * iVar1 + (long)iVar3) * (long)iVar14 + lVar24) * sVar7
                                  + (long)pvVar10);
                iVar13 = uVar17 - 1;
                do {
                  memcpy(pvVar21,(void *)((long)pvVar10 +
                                         (long)iVar1 * sVar7 * lVar23 * iVar14 + lVar24 * sVar7),__n
                        );
                  pvVar21 = (void *)((long)pvVar21 + __n);
                  iVar13 = iVar13 + -1;
                } while (iVar13 != 0);
              }
              lVar23 = lVar23 + 1;
            } while (lVar23 != lVar16);
          }
        }
        if (1 < (int)uVar18) {
          lVar23 = top_blob->cstep * local_68;
          pvVar10 = top_blob->data;
          sVar7 = top_blob->elemsize;
          pvVar21 = (void *)((top_blob->w * lVar16 * (long)top_blob->h + lVar23) * sVar7 +
                            (long)pvVar10);
          iVar14 = uVar18 - 1;
          do {
            memcpy(pvVar21,(void *)(lVar23 * sVar7 + (long)pvVar10),__n_00);
            pvVar21 = (void *)((long)pvVar21 + __n_00);
            iVar14 = iVar14 + -1;
          } while (iVar14 != 0);
        }
        local_68 = local_68 + 1;
      } while (local_68 != uVar5);
    }
    iVar14 = 0;
    if (1 < (int)uVar22) {
      lVar23 = (long)(int)uVar5;
      lVar24 = (ulong)uVar22 - 1;
      lVar16 = lVar23;
      do {
        memcpy((void *)(top_blob->cstep * lVar16 * top_blob->elemsize + (long)top_blob->data),
               top_blob->data,top_blob->cstep * lVar23 * 4);
        lVar16 = lVar16 + lVar23;
        lVar24 = lVar24 + -1;
      } while (lVar24 != 0);
    }
  }
  return iVar14;
}

Assistant:

int Tile::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;
    int repeat_w = 1;
    int repeat_h = 1;
    int repeat_d = 1;
    int repeat_c = 1;

    const int repeats_num = repeats.w;

    if (repeats.empty())
    {
        if (dims == 1) // axis == 0
        {
            repeat_w = tiles;
        }
        else if (dims == 2)
        {
            if (axis == 0) repeat_h = tiles;
            if (axis == 1) repeat_w = tiles;
        }
        else if (dims == 3)
        {
            if (axis == 0) repeat_c = tiles;
            if (axis == 1) repeat_h = tiles;
            if (axis == 2) repeat_w = tiles;
        }
        else if (dims == 4)
        {
            if (axis == 0) repeat_c = tiles;
            if (axis == 1) repeat_d = tiles;
            if (axis == 2) repeat_h = tiles;
            if (axis == 3) repeat_w = tiles;
        }
    }
    else
    {
        // numpy style tile
        const int* repeats_ptr = repeats;

        if (repeats_num == 1)
        {
            repeat_w = repeats_ptr[0];
        }
        if (repeats_num == 2)
        {
            repeat_h = repeats_ptr[0];
            repeat_w = repeats_ptr[1];
        }
        if (repeats_num == 3)
        {
            if (dims == 4)
            {
                repeat_d = repeats_ptr[0];
                repeat_h = repeats_ptr[1];
                repeat_w = repeats_ptr[2];
            }
            else
            {
                repeat_c = repeats_ptr[0];
                repeat_h = repeats_ptr[1];
                repeat_w = repeats_ptr[2];
            }
        }
        if (repeats_num == 4)
        {
            repeat_c = repeats_ptr[0];
            repeat_d = repeats_ptr[1];
            repeat_h = repeats_ptr[2];
            repeat_w = repeats_ptr[3];
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int outdims = std::max(dims, repeats_num);
    if (repeat_w != 1 && repeat_h == 1 && repeat_d == 1 && repeat_c == 1)
    {
        if (outdims == 1)
            top_blob.create(w * repeat_w, elemsize, opt.blob_allocator);
        if (outdims == 2)
            top_blob.create(w * repeat_w, h, elemsize, opt.blob_allocator);
        if (outdims == 3)
            top_blob.create(w * repeat_w, h, channels, elemsize, opt.blob_allocator);
        if (outdims == 4)
            top_blob.create(w * repeat_w, h, d, channels, elemsize, opt.blob_allocator);
    }
    else if (repeat_h != 1 && repeat_d == 1 && repeat_c == 1)
    {
        if (outdims == 2)
            top_blob.create(w * repeat_w, h * repeat_h, elemsize, opt.blob_allocator);
        if (outdims == 3)
            top_blob.create(w * repeat_w, h * repeat_h, channels, elemsize, opt.blob_allocator);
        if (outdims == 4)
            top_blob.create(w * repeat_w, h * repeat_h, d, channels, elemsize, opt.blob_allocator);
    }
    else if (repeat_d == 1 && repeat_c != 1)
    {
        if (outdims == 3)
            top_blob.create(w * repeat_w, h * repeat_h, channels * repeat_c, elemsize, opt.blob_allocator);
        if (outdims == 4)
            top_blob.create(w * repeat_w, h * repeat_h, d, channels * repeat_c, elemsize, opt.blob_allocator);
    }
    else if (repeat_d != 1 && repeat_c != 1)
    {
        if (outdims == 4)
            top_blob.create(w * repeat_w, h * repeat_h, d * repeat_d, channels * repeat_c, elemsize, opt.blob_allocator);
    }
    else // all ones
    {
        if (repeats_num == 0 || dims == repeats_num)
        {
            top_blob = bottom_blob;
            return 0;
        }

        if (outdims == 2)
            top_blob.create(w * repeat_w, h * repeat_h, elemsize, opt.blob_allocator);
        if (outdims == 3)
            top_blob.create(w * repeat_w, h * repeat_h, channels * repeat_c, elemsize, opt.blob_allocator);
        if (outdims == 4)
            top_blob.create(w * repeat_w, h * repeat_h, d * repeat_d, channels * repeat_c, elemsize, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        // repeat 0-w
        for (int z = 0; z < d; z++)
        {
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.channel(q).depth(z).row(y);
                float* outptr = top_blob.channel(q).depth(z).row(y);

                for (int p = 0; p < repeat_w; p++)
                {
                    memcpy(outptr, ptr, w * sizeof(float));
                    outptr += w;
                }
            }
        }

        // repeat 1-h
        for (int z = 0; z < d; z++)
        {
            const float* ptr = top_blob.channel(q).depth(z);
            float* outptr = top_blob.channel(q).depth(z).row(h);

            const int size = w * repeat_w * h;
            for (int p = 1; p < repeat_h; p++)
            {
                memcpy(outptr, ptr, size * sizeof(float));
                outptr += size;
            }
        }

        // repeat 1-d
        {
            const float* ptr = top_blob.channel(q);
            float* outptr = top_blob.channel(q).depth(d);

            const int size = w * repeat_w * h * repeat_h * d;
            for (int p = 1; p < repeat_d; p++)
            {
                memcpy(outptr, ptr, size * sizeof(float));
                outptr += size;
            }
        }
    }

    // repeat 1-c
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 1; p < repeat_c; p++)
    {
        const float* ptr = top_blob.channel_range(0, channels);
        float* outptr = top_blob.channel_range(p * channels, channels);

        memcpy(outptr, ptr, top_blob.cstep * channels * sizeof(float));
    }

    return 0;
}